

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O2

void __thiscall
myvk::FrameManager::initialize
          (FrameManager *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,uint32_t frame_count,VkImageUsageFlags image_usage)

{
  Ptr<Swapchain> *this_00;
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  ulong __new_size;
  undefined1 local_78 [72];
  
  local_78._48_8_ = graphics_queue;
  Swapchain::Create((Swapchain *)local_78,graphics_queue,present_queue,use_vsync,image_usage);
  this_00 = &this->m_swapchain;
  std::__shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  SwapchainImage::Create
            ((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
              *)local_78,this_00);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::_M_move_assign(&this->m_swapchain_images,
                   (vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                    *)local_78);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *)local_78);
  local_78._24_8_ = this;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::resize(&this->m_swapchain_image_views,
           (ulong)((this->m_swapchain).
                   super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_image_count);
  lVar3 = 0;
  for (uVar4 = 0; uVar1 = local_78._24_8_,
      __new_size = (ulong)((this_00->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->m_image_count, uVar4 < __new_size; uVar4 = uVar4 + 1) {
    ImageView::Create((ImageView *)local_78,
                      (Ptr<SwapchainImage> *)
                      ((long)&(((this->m_swapchain_images).
                                super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar3));
    std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_swapchain_image_views).
                         super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar3),(__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    lVar3 = lVar3 + 0x10;
  }
  *(uint32_t *)(local_78._24_8_ + 0x24) = frame_count;
  local_78._0_8_ = (pointer)0x0;
  std::vector<const_myvk::Fence_*,_std::allocator<const_myvk::Fence_*>_>::resize
            ((vector<const_myvk::Fence_*,_std::allocator<const_myvk::Fence_*>_> *)
             (local_78._24_8_ + 0x88),__new_size,(value_type *)local_78);
  uVar4 = (ulong)frame_count;
  std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::resize
            ((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )(uVar1 + 0xa0),uVar4);
  local_78._40_8_ = uVar1 + 0xb8;
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)local_78._40_8_,uVar4);
  local_78._32_8_ = uVar1 + 0xd0;
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)local_78._32_8_,uVar4);
  std::
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  ::resize((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
            *)(uVar1 + 0xe8),uVar4);
  for (lVar3 = 0; uVar4 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    iVar2 = (*(((this_00->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_DeviceObjectBase).super_Base._vptr_Base[2])();
    Fence::Create((Fence *)local_78,(Ptr<Device> *)CONCAT44(extraout_var,iVar2),1);
    std::__shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                            *)(uVar1 + 0xa0))->
                         super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar3),
               (__shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    iVar2 = (*(((this_00->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_DeviceObjectBase).super_Base._vptr_Base[2])();
    Semaphore::Create((Semaphore *)local_78,(Ptr<Device> *)CONCAT44(extraout_var_00,iVar2));
    std::__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((_Vector_impl_data *)
                        &(((Queue *)local_78._40_8_)->super_DeviceObjectBase).super_Base)->_M_start
                       ->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar3),(__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    iVar2 = (*(((this_00->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_DeviceObjectBase).super_Base._vptr_Base[2])();
    Semaphore::Create((Semaphore *)local_78,(Ptr<Device> *)CONCAT44(extraout_var_01,iVar2));
    std::__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((((_Vector_base<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
                            *)local_78._32_8_)->_M_impl).super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar3),(__shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    CommandPool::Create((CommandPool *)(local_78 + 0x38),(Ptr<Queue> *)local_78._48_8_,0);
    CommandBuffer::Create
              ((CommandBuffer *)local_78,(Ptr<CommandPool> *)(local_78 + 0x38),
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    std::__shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                            *)(uVar1 + 0xe8))->
                         super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar3),(__shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x40));
  }
  return;
}

Assistant:

void FrameManager::initialize(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue, bool use_vsync,
                              uint32_t frame_count, VkImageUsageFlags image_usage) {
	m_swapchain = myvk::Swapchain::Create(graphics_queue, present_queue, use_vsync, image_usage);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);

	m_frame_count = frame_count;
	m_image_fences.resize(m_swapchain->GetImageCount(), nullptr);

	m_frame_fences.resize(frame_count);
	m_render_done_semaphores.resize(frame_count);
	m_acquire_done_semaphores.resize(frame_count);
	m_frame_command_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		m_frame_fences[i] = Fence::Create(m_swapchain->GetDevicePtr(), VK_FENCE_CREATE_SIGNALED_BIT);
		m_render_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_acquire_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_frame_command_buffers[i] = myvk::CommandBuffer::Create(myvk::CommandPool::Create(graphics_queue));
	}
}